

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O0

size_t Output::VerboseNote(char16 *format,...)

{
  char in_AL;
  int iVar1;
  PAL_FILE *pPVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [8];
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  char16 *local_40;
  size_t size;
  va_list argptr;
  AutoCriticalSection autocs;
  char16 *format_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  if ((DAT_01ec73ca & 1) == 0) {
    format_local = (char16 *)0x0;
  }
  else {
    local_100 = in_RSI;
    local_f8 = in_RDX;
    local_f0 = in_RCX;
    local_e8 = in_R8;
    local_e0 = in_R9;
    AutoCriticalSection::AutoCriticalSection
              ((AutoCriticalSection *)&argptr[0].reg_save_area,&s_critsect);
    argptr[0].overflow_arg_area = local_108;
    argptr[0]._0_8_ = &stack0x00000008;
    size._4_4_ = 0x30;
    size._0_4_ = 8;
    pPVar2 = PAL_get_stdout(0);
    iVar1 = PAL_vfwprintf(pPVar2,format,(__va_list_tag *)&size);
    local_40 = (char16 *)(long)iVar1;
    pPVar2 = PAL_get_stdout(0);
    PAL_fflush(pPVar2);
    format_local = local_40;
    AutoCriticalSection::~AutoCriticalSection((AutoCriticalSection *)&argptr[0].reg_save_area);
  }
  return (size_t)format_local;
}

Assistant:

size_t __cdecl
Output::VerboseNote(const char16 * format, ...)
{
#ifdef ENABLE_TRACE
    if (Js::Configuration::Global.flags.Verbose)
    {
        AutoCriticalSection autocs(&s_critsect);
        va_list argptr;
        va_start(argptr, format);
        size_t size = vfwprintf(stdout, format, argptr);
        fflush(stdout);
        va_end(argptr);
        return size;
    }
#endif
    return 0;
}